

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O0

void __thiscall cmCPackIFWInstaller::ConfigureFromOptions(cmCPackIFWInstaller *this)

{
  cmCPackLog *this_00;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  allocator local_939;
  string local_938;
  allocator local_911;
  string local_910;
  char *local_8f0;
  char *optIFW_PACKAGE_RESOURCES;
  string local_8e0;
  char *local_8c0;
  char *optIFW_CONTROL_SCRIPT;
  string local_8b0;
  allocator local_889;
  string local_888;
  allocator local_861;
  string local_860;
  allocator local_839;
  string local_838;
  allocator local_811;
  string local_810;
  char *local_7f0;
  char *optIFW_MAINTENANCE_TOOL_INI;
  string local_7e0;
  char *local_7c0;
  char *optIFW_MAINTENANCE_TOOL;
  string local_7b0;
  char *local_790;
  char *option_12;
  string local_780;
  char *local_760;
  char *optPACKAGE_INSTALL_DIRECTORY;
  string local_750;
  char *local_730;
  char *optIFW_TARGET_DIRECTORY;
  string local_720;
  char *local_700;
  char *optIFW_START_MENU_DIR;
  string local_6f0;
  char *local_6d0;
  char *option_11;
  string local_6c0;
  char *local_6a0;
  char *option_10;
  string local_690;
  char *local_670;
  char *option_9;
  ostringstream local_648 [8];
  ostringstream cmCPackLog_msg;
  allocator local_4c9;
  string local_4c8;
  char *local_4a8;
  char *option_8;
  string local_498;
  allocator local_471;
  string local_470;
  allocator local_449;
  string local_448;
  char *local_428;
  char *option_7;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  char *local_3a8;
  char *option_6;
  string local_398;
  allocator local_371;
  string local_370;
  allocator local_349;
  string local_348;
  char *local_328;
  char *option_5;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  char *local_2a8;
  char *option_4;
  string local_298;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  char *local_228;
  char *option_3;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  char *local_1a8;
  char *option_2;
  string local_198;
  char *local_178;
  char *option_1;
  string local_168;
  char *local_148;
  char *optPACKAGE_VENDOR;
  string local_138;
  char *local_118;
  char *optIFW_PACKAGE_PUBLISHER;
  string local_108;
  char *local_e8;
  char *option;
  string local_d8;
  char *local_b8;
  char *optPACKAGE_DESCRIPTION_SUMMARY;
  string local_a8;
  char *local_88;
  char *optIFW_PACKAGE_TITLE;
  string local_78;
  char *local_58;
  char *optPACKAGE_NAME;
  allocator local_39;
  string local_38;
  char *local_18;
  char *optIFW_PACKAGE_NAME;
  cmCPackIFWInstaller *this_local;
  
  optIFW_PACKAGE_NAME = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CPACK_IFW_PACKAGE_NAME",&local_39);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,"CPACK_PACKAGE_NAME",
               (allocator *)((long)&optIFW_PACKAGE_TITLE + 7));
    pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_PACKAGE_TITLE + 7));
    local_58 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Name,"Your package");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Name,pcVar2);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->Name,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a8,"CPACK_IFW_PACKAGE_TITLE",
             (allocator *)((long)&optPACKAGE_DESCRIPTION_SUMMARY + 7));
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optPACKAGE_DESCRIPTION_SUMMARY + 7));
  local_88 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d8,"CPACK_PACKAGE_DESCRIPTION_SUMMARY",
               (allocator *)((long)&option + 7));
    pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&option + 7));
    local_b8 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Title,"Your package description");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Title,pcVar2);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->Title,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_108,"CPACK_PACKAGE_VERSION",
             (allocator *)((long)&optIFW_PACKAGE_PUBLISHER + 7));
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_PACKAGE_PUBLISHER + 7));
  local_e8 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->Version,"1.0.0");
  }
  else {
    std::__cxx11::string::operator=((string *)&this->Version,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_138,"CPACK_IFW_PACKAGE_PUBLISHER",
             (allocator *)((long)&optPACKAGE_VENDOR + 7));
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optPACKAGE_VENDOR + 7));
  local_118 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_168,"CPACK_PACKAGE_VENDOR",(allocator *)((long)&option_1 + 7));
    pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)((long)&option_1 + 7));
    local_148 = pcVar2;
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Publisher,pcVar2);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->Publisher,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_198,"CPACK_IFW_PRODUCT_URL",(allocator *)((long)&option_2 + 7));
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&option_2 + 7));
  local_178 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->ProductUrl,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c8,"CPACK_IFW_PACKAGE_ICON",&local_1c9);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  local_1a8 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->InstallerApplicationIcon,local_1a8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f0,"CPACK_IFW_PACKAGE_ICON",&local_1f1);
      pcVar2 = local_1a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_218,pcVar2,(allocator *)((long)&option_3 + 7));
      printSkippedOptionWarning(this,&local_1f0,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option_3 + 7));
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"CPACK_IFW_PACKAGE_WINDOW_ICON",&local_249);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  local_228 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->InstallerWindowIcon,local_228);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_270,"CPACK_IFW_PACKAGE_WINDOW_ICON",&local_271);
      pcVar2 = local_228;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_298,pcVar2,(allocator *)((long)&option_4 + 7));
      printSkippedOptionWarning(this,&local_270,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option_4 + 7));
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"CPACK_IFW_PACKAGE_LOGO",&local_2c9);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  local_2a8 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->Logo,local_2a8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2f0,"CPACK_IFW_PACKAGE_LOGO",&local_2f1);
      pcVar2 = local_2a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_318,pcVar2,(allocator *)((long)&option_5 + 7));
      printSkippedOptionWarning(this,&local_2f0,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option_5 + 7));
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"CPACK_IFW_PACKAGE_WATERMARK",&local_349);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  local_328 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->Watermark,local_328);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_370,"CPACK_IFW_PACKAGE_WATERMARK",&local_371);
      pcVar2 = local_328;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_398,pcVar2,(allocator *)((long)&option_6 + 7));
      printSkippedOptionWarning(this,&local_370,&local_398);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option_6 + 7));
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c8,"CPACK_IFW_PACKAGE_BANNER",&local_3c9);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  local_3a8 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->Banner,local_3a8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3f0,"CPACK_IFW_PACKAGE_BANNER",&local_3f1);
      pcVar2 = local_3a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_418,pcVar2,(allocator *)((long)&option_7 + 7));
      printSkippedOptionWarning(this,&local_3f0,&local_418);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option_7 + 7));
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_448,"CPACK_IFW_PACKAGE_BACKGROUND",&local_449);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  local_428 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->Background,local_428);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_470,"CPACK_IFW_PACKAGE_BACKGROUND",&local_471);
      pcVar2 = local_428;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_498,pcVar2,(allocator *)((long)&option_8 + 7));
      printSkippedOptionWarning(this,&local_470,&local_498);
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option_8 + 7));
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator((allocator<char> *)&local_471);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c8,"CPACK_IFW_PACKAGE_WIZARD_STYLE",&local_4c9);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  local_4a8 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->WizardStyle,pcVar2);
    bVar1 = std::operator!=(&this->WizardStyle,"Modern");
    if ((((bVar1) && (bVar1 = std::operator!=(&this->WizardStyle,"Aero"), bVar1)) &&
        (bVar1 = std::operator!=(&this->WizardStyle,"Mac"), bVar1)) &&
       (bVar1 = std::operator!=(&this->WizardStyle,"Classic"), bVar1)) {
      std::__cxx11::ostringstream::ostringstream(local_648);
      poVar3 = std::operator<<((ostream *)local_648,
                               "Option CPACK_IFW_PACKAGE_WIZARD_STYLE has unknown value \"");
      poVar3 = std::operator<<(poVar3,local_4a8);
      poVar3 = std::operator<<(poVar3,"\". Expected values are: Modern, Aero, Mac, Classic.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
        this_00 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar2 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(this_00,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWInstaller.cxx"
                        ,0x8e,pcVar2);
        std::__cxx11::string::~string((string *)&option_9);
      }
      std::__cxx11::ostringstream::~ostringstream(local_648);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_690,"CPACK_IFW_PACKAGE_WIZARD_DEFAULT_WIDTH",
             (allocator *)((long)&option_10 + 7));
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator((allocator<char> *)((long)&option_10 + 7));
  local_670 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->WizardDefaultWidth,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6c0,"CPACK_IFW_PACKAGE_WIZARD_DEFAULT_HEIGHT",
             (allocator *)((long)&option_11 + 7));
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_6c0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&option_11 + 7));
  local_6a0 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->WizardDefaultHeight,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6f0,"CPACK_IFW_PACKAGE_TITLE_COLOR",
             (allocator *)((long)&optIFW_START_MENU_DIR + 7));
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_6f0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_START_MENU_DIR + 7));
  local_6d0 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->TitleColor,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_720,"CPACK_IFW_PACKAGE_START_MENU_DIRECTORY",
             (allocator *)((long)&optIFW_TARGET_DIRECTORY + 7));
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_720);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_TARGET_DIRECTORY + 7));
  local_700 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->StartMenuDir,(string *)&this->Name);
  }
  else {
    std::__cxx11::string::operator=((string *)&this->StartMenuDir,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_750,"CPACK_IFW_TARGET_DIRECTORY",
             (allocator *)((long)&optPACKAGE_INSTALL_DIRECTORY + 7));
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_750);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optPACKAGE_INSTALL_DIRECTORY + 7));
  local_730 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_780,"CPACK_PACKAGE_INSTALL_DIRECTORY",
               (allocator *)((long)&option_12 + 7));
    pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_780);
    std::__cxx11::string::~string((string *)&local_780);
    std::allocator<char>::~allocator((allocator<char> *)((long)&option_12 + 7));
    local_760 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->TargetDir,"@RootDir@/usr/local");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->TargetDir,"@ApplicationsDir@/");
      std::__cxx11::string::operator+=((string *)&this->TargetDir,local_760);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->TargetDir,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7b0,"CPACK_IFW_ADMIN_TARGET_DIRECTORY",
             (allocator *)((long)&optIFW_MAINTENANCE_TOOL + 7));
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_7b0);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_MAINTENANCE_TOOL + 7));
  local_790 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->AdminTargetDir,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7e0,"CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_NAME",
             (allocator *)((long)&optIFW_MAINTENANCE_TOOL_INI + 7));
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_MAINTENANCE_TOOL_INI + 7));
  local_7c0 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->MaintenanceToolName,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_810,"CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_INI_FILE",&local_811);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_810);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  local_7f0 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->MaintenanceToolIniFile,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_838,"CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS",&local_839);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_838);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  if (pcVar2 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_860,"CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS",&local_861);
    bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_860);
    std::__cxx11::string::~string((string *)&local_860);
    std::allocator<char>::~allocator((allocator<char> *)&local_861);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->AllowNonAsciiCharacters,"true");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->AllowNonAsciiCharacters,"false");
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_888,"CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH",&local_889);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_888);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator((allocator<char> *)&local_889);
  if (pcVar2 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_8b0,"CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH",
               (allocator *)((long)&optIFW_CONTROL_SCRIPT + 7));
    bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_8b0);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_CONTROL_SCRIPT + 7));
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->AllowSpaceInPath,"true");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->AllowSpaceInPath,"false");
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8e0,"CPACK_IFW_PACKAGE_CONTROL_SCRIPT",
             (allocator *)((long)&optIFW_PACKAGE_RESOURCES + 7));
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_8e0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_PACKAGE_RESOURCES + 7));
  local_8c0 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->ControlScript,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_910,"CPACK_IFW_PACKAGE_RESOURCES",&local_911);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_910);
  std::__cxx11::string::~string((string *)&local_910);
  std::allocator<char>::~allocator((allocator<char> *)&local_911);
  if (pcVar2 != (char *)0x0) {
    local_8f0 = pcVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->Resources);
    pcVar2 = local_8f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_938,pcVar2,&local_939);
    cmSystemTools::ExpandListArgument(&local_938,&this->Resources,false);
    std::__cxx11::string::~string((string *)&local_938);
    std::allocator<char>::~allocator((allocator<char> *)&local_939);
  }
  return;
}

Assistant:

void cmCPackIFWInstaller::ConfigureFromOptions()
{
  // Name;
  if (const char* optIFW_PACKAGE_NAME =
        this->GetOption("CPACK_IFW_PACKAGE_NAME")) {
    this->Name = optIFW_PACKAGE_NAME;
  } else if (const char* optPACKAGE_NAME =
               this->GetOption("CPACK_PACKAGE_NAME")) {
    this->Name = optPACKAGE_NAME;
  } else {
    this->Name = "Your package";
  }

  // Title;
  if (const char* optIFW_PACKAGE_TITLE =
        this->GetOption("CPACK_IFW_PACKAGE_TITLE")) {
    this->Title = optIFW_PACKAGE_TITLE;
  } else if (const char* optPACKAGE_DESCRIPTION_SUMMARY =
               this->GetOption("CPACK_PACKAGE_DESCRIPTION_SUMMARY")) {
    this->Title = optPACKAGE_DESCRIPTION_SUMMARY;
  } else {
    this->Title = "Your package description";
  }

  // Version;
  if (const char* option = this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = option;
  } else {
    this->Version = "1.0.0";
  }

  // Publisher
  if (const char* optIFW_PACKAGE_PUBLISHER =
        this->GetOption("CPACK_IFW_PACKAGE_PUBLISHER")) {
    this->Publisher = optIFW_PACKAGE_PUBLISHER;
  } else if (const char* optPACKAGE_VENDOR =
               GetOption("CPACK_PACKAGE_VENDOR")) {
    this->Publisher = optPACKAGE_VENDOR;
  }

  // ProductUrl
  if (const char* option = this->GetOption("CPACK_IFW_PRODUCT_URL")) {
    this->ProductUrl = option;
  }

  // ApplicationIcon
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_ICON")) {
    if (cmSystemTools::FileExists(option)) {
      this->InstallerApplicationIcon = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_ICON", option);
    }
  }

  // WindowIcon
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_WINDOW_ICON")) {
    if (cmSystemTools::FileExists(option)) {
      this->InstallerWindowIcon = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_WINDOW_ICON", option);
    }
  }

  // Logo
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_LOGO")) {
    if (cmSystemTools::FileExists(option)) {
      this->Logo = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_LOGO", option);
    }
  }

  // Watermark
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_WATERMARK")) {
    if (cmSystemTools::FileExists(option)) {
      this->Watermark = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_WATERMARK", option);
    }
  }

  // Banner
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_BANNER")) {
    if (cmSystemTools::FileExists(option)) {
      this->Banner = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_BANNER", option);
    }
  }

  // Background
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_BACKGROUND")) {
    if (cmSystemTools::FileExists(option)) {
      this->Background = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_BACKGROUND", option);
    }
  }

  // WizardStyle
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_WIZARD_STYLE")) {
    // Setting the user value in any case
    this->WizardStyle = option;
    // Check known values
    if (this->WizardStyle != "Modern" && this->WizardStyle != "Aero" &&
        this->WizardStyle != "Mac" && this->WizardStyle != "Classic") {
      cmCPackIFWLogger(
        WARNING, "Option CPACK_IFW_PACKAGE_WIZARD_STYLE has unknown value \""
          << option << "\". Expected values are: Modern, Aero, Mac, Classic."
          << std::endl);
    }
  }

  // WizardDefaultWidth
  if (const char* option =
        this->GetOption("CPACK_IFW_PACKAGE_WIZARD_DEFAULT_WIDTH")) {
    this->WizardDefaultWidth = option;
  }

  // WizardDefaultHeight
  if (const char* option =
        this->GetOption("CPACK_IFW_PACKAGE_WIZARD_DEFAULT_HEIGHT")) {
    this->WizardDefaultHeight = option;
  }

  // TitleColor
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_TITLE_COLOR")) {
    this->TitleColor = option;
  }

  // Start menu
  if (const char* optIFW_START_MENU_DIR =
        this->GetOption("CPACK_IFW_PACKAGE_START_MENU_DIRECTORY")) {
    this->StartMenuDir = optIFW_START_MENU_DIR;
  } else {
    this->StartMenuDir = Name;
  }

  // Default target directory for installation
  if (const char* optIFW_TARGET_DIRECTORY =
        this->GetOption("CPACK_IFW_TARGET_DIRECTORY")) {
    this->TargetDir = optIFW_TARGET_DIRECTORY;
  } else if (const char* optPACKAGE_INSTALL_DIRECTORY =
               this->GetOption("CPACK_PACKAGE_INSTALL_DIRECTORY")) {
    this->TargetDir = "@ApplicationsDir@/";
    this->TargetDir += optPACKAGE_INSTALL_DIRECTORY;
  } else {
    this->TargetDir = "@RootDir@/usr/local";
  }

  // Default target directory for installation with administrator rights
  if (const char* option =
        this->GetOption("CPACK_IFW_ADMIN_TARGET_DIRECTORY")) {
    this->AdminTargetDir = option;
  }

  // Maintenance tool
  if (const char* optIFW_MAINTENANCE_TOOL =
        this->GetOption("CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_NAME")) {
    this->MaintenanceToolName = optIFW_MAINTENANCE_TOOL;
  }

  // Maintenance tool ini file
  if (const char* optIFW_MAINTENANCE_TOOL_INI =
        this->GetOption("CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_INI_FILE")) {
    this->MaintenanceToolIniFile = optIFW_MAINTENANCE_TOOL_INI;
  }

  // Allow non-ASCII characters
  if (this->GetOption("CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS")) {
    if (this->IsOn("CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS")) {
      this->AllowNonAsciiCharacters = "true";
    } else {
      this->AllowNonAsciiCharacters = "false";
    }
  }

  // Space in path
  if (this->GetOption("CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH")) {
    if (this->IsOn("CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH")) {
      this->AllowSpaceInPath = "true";
    } else {
      this->AllowSpaceInPath = "false";
    }
  }

  // Control script
  if (const char* optIFW_CONTROL_SCRIPT =
        this->GetOption("CPACK_IFW_PACKAGE_CONTROL_SCRIPT")) {
    this->ControlScript = optIFW_CONTROL_SCRIPT;
  }

  // Resources
  if (const char* optIFW_PACKAGE_RESOURCES =
        this->GetOption("CPACK_IFW_PACKAGE_RESOURCES")) {
    this->Resources.clear();
    cmSystemTools::ExpandListArgument(optIFW_PACKAGE_RESOURCES,
                                      this->Resources);
  }
}